

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bootup.c
# Opt level: O3

void __thiscall CMud::LoadTime(CMud *this)

{
  long lVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  ulong uVar5;
  int iVar6;
  long lVar7;
  ushort uVar8;
  char cVar9;
  
  lVar1 = current_time + -0x39f53371;
  lVar2 = current_time + (lVar1 / 0x5a0) * -0x5a0;
  lVar7 = lVar2 + -0x39f53371;
  uVar4 = ((uint)((short)lVar7 * -0x7777) >> 0x10) + (int)lVar7;
  uVar8 = ((short)uVar4 >> 5) + (short)((uVar4 & 0xffff) >> 0xf);
  time_info.hour = (int)(short)uVar8;
  time_info.day = ((int)(lVar1 / 0xa8c0) * -0xa8c0 + (int)current_time + -0x39f53371) / 0x5a0;
  uVar5 = (SUB168(SEXT816(lVar1) * SEXT816(-0x7e8bd1fbb3a478db),8) + current_time) - 0x39f53371;
  iVar6 = (int)(uVar5 >> 0x12);
  iVar3 = (int)((long)uVar5 >> 0x3f);
  time_info.month = ((int)lVar1 + (iVar6 - iVar3) * -0x7e900) / 0xa8c0;
  time_info.year = (iVar6 - iVar3) + 0x5eb;
  cVar9 = (char)time_info.month + '\x01';
  uVar4 = cVar9 * 0x2b & 0xffff;
  uVar4 = (char)(cVar9 + ((char)(uVar4 >> 9) + (char)(uVar4 >> 0xf)) * -0xc) * 0x56;
  time_info.season = (int)(char)((char)((uVar4 & 0xffff) >> 0xf) + (char)(uVar4 >> 8));
  if (lVar7 < 300) {
    sun = 0;
  }
  else {
    sun = 1;
    if ((0x3b < (ushort)((short)lVar2 + 0xcb63U)) && (sun = 2, 0x12 < uVar8)) {
      sun = (ushort)((ushort)((short)lVar7 - 0x474U) < 0x3c) * 3;
    }
  }
  berus_pos = (short)((short)lVar1 +
                     ((short)(SUB168(SEXT816(lVar1) * ZEXT816(0x81742e044c5b8725),8) >> 0xe) -
                     (SUB162(SEXT816(lVar1) * ZEXT816(0x81742e044c5b8725),0xe) >> 0xf)) * -0x7e90) /
              0x5a;
  iVar6 = (int)lVar1 +
          ((int)(SUB168(SEXT816(lVar1) * ZEXT816(0x9b5837385ba10893),8) >> 0xf) -
          (SUB164(SEXT816(lVar1) * ZEXT816(0x9b5837385ba10893),0xc) >> 0x1f)) * -54000;
  calabren_pos = (short)(uint)((ulong)((long)iVar6 * 0x1b4e81b5) >> 0x24) - (short)(iVar6 >> 0x1f);
  return;
}

Assistant:

void CMud::LoadTime()
{
	long lhour;

	lhour = (current_time - 650336715) / (PULSE_TICK / PULSE_PER_SECOND);
	time_info.hour = ((current_time - RS_EPOCH) % (60 * 24)) / (60);
	time_info.day = ((current_time - RS_EPOCH) % (60 * 60 * 12)) / (60 * 24);
	time_info.month = ((current_time - RS_EPOCH) % (60 * 60 * 24 * 6)) / (60 * 60 * 12);
	time_info.year  = 1515 + (current_time - RS_EPOCH) / (60 * 60 * 24 * 6);
	time_info.season= ((time_info.month + 1) % 12) / 3;

	if ( time_info.hour <  5 )
		sun = SolarPosition::Dark;
	else if ( time_info.hour <  6 )
		sun = SolarPosition::Sunrise;
	else if ( time_info.hour < 19 )
		sun = SolarPosition::Daylight;
	else if ( time_info.hour < 20 )
		sun = SolarPosition::Sunset;
	else
		sun = SolarPosition::Dark;

	berus_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Berus*360))/LunarSpeed::Berus;
	calabren_pos = ((current_time-RS_EPOCH)%(LunarSpeed::Calabren*360))/LunarSpeed::Calabren;
}